

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::CommandDiagReset
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aAddr,uint64_t aDiagDataFlags)

{
  bool bVar1;
  uint uVar2;
  Error *pEVar3;
  ulong uVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  Error local_5c0;
  ErrorCode local_598;
  anon_class_1_0_00000001 local_592;
  v10 local_591;
  v10 *local_590;
  size_t local_588;
  string local_580;
  allocator local_559;
  string local_558;
  ResponseHandler local_538;
  ErrorCode local_514;
  Error local_510;
  ResponseHandler local_4e8;
  anon_class_1_0_00000001 local_4c2;
  v10 local_4c1;
  v10 *local_4c0;
  size_t local_4b8;
  string local_4b0;
  allocator local_489;
  string local_488;
  ErrorCode local_464;
  Error local_460;
  ErrorCode local_434;
  ByteArray local_430;
  Tlv local_418;
  Error local_3f8;
  ErrorCode local_3d0;
  allocator local_3c9;
  string local_3c8;
  Error local_3a8;
  anon_class_1_0_00000001 local_37a;
  v10 local_379;
  v10 *local_378;
  size_t local_370;
  string local_368;
  Error local_348;
  undefined1 local_320 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_2f0 [8];
  Request request;
  Address dstAddr;
  Error error;
  uint64_t aDiagDataFlags_local;
  string *aAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_1f0 [16];
  v10 *local_1e0;
  ulong local_1d8;
  v10 *local_1d0;
  size_t sStack_1c8;
  string *local_1c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1b8 [3];
  undefined1 local_1a0 [16];
  v10 *local_190;
  ulong local_188;
  v10 *local_180;
  size_t sStack_178;
  string *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_168 [2];
  undefined1 local_158 [16];
  v10 *local_148;
  ulong local_140;
  v10 *local_138;
  size_t sStack_130;
  string *local_128;
  v10 *local_120;
  v10 **local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  v10 **local_b0;
  v10 *local_a8;
  size_t sStack_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_88;
  undefined8 local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_70;
  undefined1 *local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  CommissionerImpl **local_48;
  undefined1 *local_40;
  CommissionerImpl **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  CommissionerImpl **local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error((Error *)&dstAddr.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Address::Address((Address *)&request.mEndpoint);
  coap::Message::Message((Message *)local_2f0,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_320,aHandler);
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    CommandDiagReset::anon_class_1_0_00000001::operator()(&local_37a);
    local_118 = &local_378;
    local_120 = &local_379;
    bVar5 = ::fmt::v10::operator()(local_120);
    local_370 = bVar5.size_;
    local_378 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_128 = &local_368;
    local_138 = local_378;
    sStack_130 = local_370;
    local_f0 = &local_138;
    local_148 = local_378;
    local_140 = local_370;
    local_e8 = local_148;
    sStack_e0 = local_140;
    local_168[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_90 = local_158;
    local_98 = local_168;
    local_80 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_98;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_140;
    local_88 = local_98;
    local_78 = local_90;
    local_10 = local_98;
    ::fmt::v10::vformat_abi_cxx11_(&local_368,local_148,fmt,args);
    Error::Error(&local_348,kInvalidState,&local_368);
    Error::operator=((Error *)&dstAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_348);
    Error::~Error(&local_348);
    std::__cxx11::string::~string((string *)&local_368);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"/d/dr",&local_3c9);
    coap::Message::SetUriPath(&local_3a8,(Message *)local_2f0,&local_3c8);
    pEVar3 = Error::operator=((Error *)&dstAddr.mBytes.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &local_3a8);
    local_3d0 = kNone;
    bVar1 = commissioner::operator!=(pEVar3,&local_3d0);
    Error::~Error(&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    if (!bVar1) {
      GetNetDiagTlvTypes(&local_430,aDiagDataFlags);
      tlv::Tlv::Tlv(&local_418,kJoinerUdpPort,&local_430,kNetworkDiag);
      AppendTlv(&local_3f8,(Message *)local_2f0,&local_418);
      pEVar3 = Error::operator=((Error *)&dstAddr.mBytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_3f8);
      local_434 = kNone;
      bVar1 = commissioner::operator!=(pEVar3,&local_434);
      Error::~Error(&local_3f8);
      tlv::Tlv::~Tlv(&local_418);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_430);
      if (!bVar1) {
        uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
        if ((uVar2 & 1) != 0) {
          SignRequest(&local_460,this,(Request *)local_2f0,kMeshCoP,true);
          pEVar3 = Error::operator=((Error *)&dstAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_460);
          local_464 = kNone;
          bVar1 = commissioner::operator!=(pEVar3,&local_464);
          Error::~Error(&local_460);
          if (bVar1) goto LAB_001b6334;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_488,"meshdiag",&local_489);
        CommandDiagReset::anon_class_1_0_00000001::operator()(&local_4c2);
        local_108 = &local_4c0;
        local_110 = &local_4c1;
        bVar5 = ::fmt::v10::operator()(local_110);
        local_4b8 = bVar5.size_;
        local_4c0 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_170 = &local_4b0;
        local_180 = local_4c0;
        sStack_178 = local_4b8;
        local_d0 = &local_180;
        local_190 = local_4c0;
        local_188 = local_4b8;
        local_c8 = local_190;
        sStack_c0 = local_188;
        local_1b8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_68 = local_1a0;
        local_70 = local_1b8;
        local_58 = 0;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_70;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_188;
        local_60 = local_70;
        local_50 = local_68;
        local_18 = local_70;
        ::fmt::v10::vformat_abi_cxx11_(&local_4b0,local_190,fmt_00,args_00);
        Log(kInfo,&local_488,&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_488);
        std::allocator<char>::~allocator((allocator<char> *)&local_489);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          Address::Set(&local_510,(Address *)&request.mEndpoint,aAddr);
          pEVar3 = Error::operator=((Error *)&dstAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_510);
          local_514 = kNone;
          bVar1 = commissioner::operator!=(pEVar3,&local_514);
          Error::~Error(&local_510);
          if (bVar1) goto LAB_001b6334;
          std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
          function<ot::commissioner::CommissionerImpl::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0&,void>
                    ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                      *)&local_538,(anon_class_32_1_d0c21527 *)local_320);
          ProxyClient::SendRequest
                    (&this->mProxyClient,(Request *)local_2f0,&local_538,
                     (Address *)&request.mEndpoint,0xf0bf);
          std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
          ~function(&local_538);
        }
        else {
          std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
          function<ot::commissioner::CommissionerImpl::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0&,void>
                    ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                      *)&local_4e8,(anon_class_32_1_d0c21527 *)local_320);
          ProxyClient::SendRequest
                    (&this->mProxyClient,(Request *)local_2f0,&local_4e8,0xfc00,0xf0bf);
          std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
          ~function(&local_4e8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_558,"meshdiag",&local_559);
        CommandDiagReset::anon_class_1_0_00000001::operator()(&local_592);
        local_f8 = &local_590;
        local_100 = &local_591;
        bVar5 = ::fmt::v10::operator()(local_100);
        local_588 = bVar5.size_;
        local_590 = (v10 *)bVar5.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_1c0 = &local_580;
        local_1d0 = local_590;
        sStack_1c8 = local_588;
        local_b0 = &local_1d0;
        local_1e0 = local_590;
        local_1d8 = local_588;
        local_a8 = local_1e0;
        sStack_a0 = local_1d8;
        this_local = (CommissionerImpl *)
                     ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_40 = local_1f0;
        local_48 = &this_local;
        local_30 = 0;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_48;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_1d8;
        local_38 = local_48;
        local_28 = local_40;
        local_20 = local_48;
        ::fmt::v10::vformat_abi_cxx11_(&local_580,local_1e0,fmt_01,args_01);
        Log(kInfo,&local_558,&local_580);
        std::__cxx11::string::~string((string *)&local_580);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator((allocator<char> *)&local_559);
      }
    }
  }
LAB_001b6334:
  local_598 = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&dstAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_598);
  if (bVar1) {
    Error::Error(&local_5c0,
                 (Error *)&dstAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_5c0);
    Error::~Error(&local_5c0);
  }
  CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)
  ::$_0::~__0((__0 *)local_320);
  coap::Message::~Message((Message *)local_2f0);
  Address::~Address((Address *)&request.mEndpoint);
  Error::~Error((Error *)&dstAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CommissionerImpl::CommandDiagReset(ErrorHandler aHandler, const std::string &aAddr, uint64_t aDiagDataFlags)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    auto          onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kDiagRst));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kNetworkDiagTypeList, GetNetDiagTlvTypes(aDiagDataFlags),
                                              tlv::Scope::kNetworkDiag}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    LOG_INFO(LOG_REGION_MESHDIAG, "sending DIAG_RST.ntf");
    if (aAddr.empty())
    {
        mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);
    }
    else
    {
        SuccessOrExit(error = dstAddr.Set(aAddr));
        mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);
    }
    LOG_INFO(LOG_REGION_MESHDIAG, "sent DIAG_RST.ntf");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}